

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O2

uint64_t llvm::hashing::detail::hash_33to64_bytes(char *s,size_t len,uint64_t seed)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  
  uVar6 = (*(long *)(s + (len - 0x10)) + len) * -0x3c5a37a36834ced9 + *(long *)s;
  uVar2 = uVar6 + *(long *)(s + 0x18);
  uVar7 = uVar6 + *(long *)(s + 8);
  uVar8 = uVar7 + *(long *)(s + 0x10);
  uVar3 = *(long *)(s + 0x10) + *(long *)(s + (len - 0x20));
  uVar1 = uVar3 + *(long *)(s + (len - 8));
  uVar4 = uVar3 + *(long *)(s + (len - 0x18));
  uVar5 = uVar4 + *(long *)(s + (len - 0x10));
  lVar9 = (uVar8 << 0x21 | uVar8 >> 0x1f) +
          (uVar7 << 0x39 | uVar7 >> 7) + (uVar6 * 0x8000000 | uVar6 >> 0x25) +
          (uVar2 * 0x1000 | uVar2 >> 0x34);
  uVar2 = (*(long *)(s + (len - 8)) + uVar5 + lVar9) * -0x3c5a37a36834ced9 +
          ((uVar3 * 0x8000000 | uVar3 >> 0x25) + *(long *)(s + 0x18) +
           (uVar1 * 0x1000 | uVar1 >> 0x34) + (uVar4 << 0x39 | uVar4 >> 7) +
           (uVar5 << 0x21 | uVar5 >> 0x1f) + uVar8) * -0x651e95c4d06fbfb1;
  uVar2 = ((uVar2 >> 0x2f ^ uVar2) * -0x3c5a37a36834ced9 ^ seed) + lVar9;
  return (uVar2 >> 0x2f ^ uVar2) * -0x651e95c4d06fbfb1;
}

Assistant:

inline uint64_t fetch64(const char *p) {
  uint64_t result;
  memcpy(&result, p, sizeof(result));
  if (sys::IsBigEndianHost)
    sys::swapByteOrder(result);
  return result;
}